

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O0

void __thiscall absl::lts_20240722::base_internal::SpinLock::Unlock(SpinLock *this)

{
  uint uVar1;
  uint32_t lock_value;
  SpinLock *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  LOCK();
  uVar1 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
  (this->lockword_).super___atomic_base<unsigned_int>._M_i =
       (this->lockword_).super___atomic_base<unsigned_int>._M_i & 2;
  UNLOCK();
  if ((uVar1 & 4) != 0) {
    SchedulingGuard::EnableRescheduling(true);
  }
  if ((uVar1 & 0xfffffff8) != 0) {
    absl::lts_20240722::base_internal::SpinLock::SlowUnlock((uint)this);
  }
  return;
}

Assistant:

inline void Unlock() ABSL_UNLOCK_FUNCTION() {
    ABSL_TSAN_MUTEX_PRE_UNLOCK(this, 0);
    uint32_t lock_value = lockword_.load(std::memory_order_relaxed);
    lock_value = lockword_.exchange(lock_value & kSpinLockCooperative,
                                    std::memory_order_release);

    if ((lock_value & kSpinLockDisabledScheduling) != 0) {
      base_internal::SchedulingGuard::EnableRescheduling(true);
    }
    if ((lock_value & kWaitTimeMask) != 0) {
      // Collect contentionz profile info, and speed the wakeup of any waiter.
      // The wait_cycles value indicates how long this thread spent waiting
      // for the lock.
      SlowUnlock(lock_value);
    }
    ABSL_TSAN_MUTEX_POST_UNLOCK(this, 0);
  }